

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedModel.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::LinkedModelFile::SerializeWithCachedSizes
          (LinkedModelFile *this,CodedOutputStream *output)

{
  bool bVar1;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  LinkedModelFile *this_local;
  
  bVar1 = has_linkedmodelfilename(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (1,&this->linkedmodelfilename_->super_MessageLite,output);
  }
  bVar1 = has_linkedmodelsearchpath(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (2,&this->linkedmodelsearchpath_->super_MessageLite,output);
  }
  return;
}

Assistant:

void LinkedModelFile::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.LinkedModelFile)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.StringParameter linkedModelFileName = 1;
  if (this->has_linkedmodelfilename()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, *this->linkedmodelfilename_, output);
  }

  // .CoreML.Specification.StringParameter linkedModelSearchPath = 2;
  if (this->has_linkedmodelsearchpath()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, *this->linkedmodelsearchpath_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.LinkedModelFile)
}